

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_findfile.c
# Opt level: O1

char * checkhome(char *home,char *fname,_Bool dotscore)

{
  int __fd;
  char *__file;
  long lVar1;
  byte bVar2;
  bool bVar3;
  char *local_40;
  
  lVar1 = 0;
  do {
    if (dotscore) {
      __file = (char *)curl_maprintf("%s/%c%s",home,(int)(char)(&DAT_00122a92)[lVar1],fname + 1);
    }
    else {
      __file = (char *)curl_maprintf("%s/%s",home,fname);
    }
    if (__file == (char *)0x0) {
      bVar2 = 1;
    }
    else {
      __fd = open64(__file,0);
      if (-1 < __fd) {
        local_40 = strdup(__file);
        close(__fd);
      }
      bVar2 = (byte)((uint)__fd >> 0x1f);
      curl_free(__file);
    }
    if (bVar2 == 0) {
      return local_40;
    }
    if (!dotscore) {
      return (char *)0x0;
    }
    bVar3 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar3);
  return (char *)0x0;
}

Assistant:

static char *checkhome(const char *home, const char *fname, bool dotscore)
{
  const char pref[2] = { '.', '_' };
  int i;
  for(i = 0; i < (dotscore ? 2 : 1); i++) {
    char *c;
    if(dotscore)
      c = aprintf("%s" DIR_CHAR "%c%s", home, pref[i], &fname[1]);
    else
      c = aprintf("%s" DIR_CHAR "%s", home, fname);
    if(c) {
      int fd = open(c, O_RDONLY);
      if(fd >= 0) {
        char *path = strdup(c);
        close(fd);
        curl_free(c);
        return path;
      }
      curl_free(c);
    }
  }
  return NULL;
}